

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O1

string * __thiscall mocker::Lexer::nextToken_abi_cxx11_(string *__return_storage_ptr__,Lexer *this)

{
  char *pcVar1;
  char *pcVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  Position tmpNxtPos;
  Position tmpCurPos;
  
  pcVar1 = (this->curBeg)._M_current;
  pcVar2 = (this->nxtBeg)._M_current;
  sVar3 = (this->curPos).line;
  sVar4 = (this->curPos).col;
  sVar5 = (this->nxtPos).line;
  sVar6 = (this->nxtPos).col;
  getToken_abi_cxx11_(__return_storage_ptr__,this);
  (this->curBeg)._M_current = pcVar1;
  (this->nxtBeg)._M_current = pcVar2;
  (this->curPos).line = sVar3;
  (this->curPos).col = sVar4;
  (this->nxtPos).line = sVar5;
  (this->nxtPos).col = sVar6;
  return __return_storage_ptr__;
}

Assistant:

std::string Lexer::nextToken() {
  auto tmpCurBeg = curBeg;
  auto tmpNxtBeg = nxtBeg;
  auto tmpCurPos = curPos;
  auto tmpNxtPos = nxtPos;
  auto res = getToken();
  std::tie(curBeg, nxtBeg, curPos, nxtPos) =
      std::tie(tmpCurBeg, tmpNxtBeg, tmpCurPos, tmpNxtPos);
  return res;
}